

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-tracer.cpp
# Opt level: O2

void __thiscall test_tracer::test_method(test_tracer *this)

{
  int iVar1;
  string *psVar2;
  long lVar3;
  string *psVar4;
  string *psVar5;
  undefined8 uVar6;
  long *plVar7;
  long *plVar8;
  string basename;
  string rootdir;
  string suffix;
  allocator<char> local_ca;
  allocator<char> local_c9;
  int local_c8 [8];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  allocator<char> local_48 [32];
  
  psVar2 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"Tracer",local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"my-tracer",(allocator<char> *)local_c8);
  lVar3 = dynamicgraph::FactoryStorage::newEntity(psVar2,local_68);
  if (lVar3 == 0) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar2 = (string *)
             __dynamic_cast(lVar3,&dynamicgraph::Entity::typeinfo,&dynamicgraph::Tracer::typeinfo,0)
    ;
  }
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_68);
  psVar4 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"MyEntity",local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"my-entity",(allocator<char> *)local_c8);
  psVar4 = (string *)dynamicgraph::FactoryStorage::newEntity(psVar4,local_68);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/tmp",(allocator<char> *)local_a8);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"my-tracer",local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,".dat",(allocator<char> *)local_c8);
  dynamicgraph::Tracer::openFiles(psVar2,local_68,local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"my-entity.out_double",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>(local_88,"output",&local_ca);
  dynamicgraph::Tracer::addSignalToTraceByName(psVar2,(string *)local_c8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"my-entity.out_vector",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>(local_88,"output-vector",&local_ca);
  dynamicgraph::Tracer::addSignalToTraceByName(psVar2,(string *)local_c8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"out2double",(allocator<char> *)local_88);
  psVar5 = (string *)dynamicgraph::Entity::getSignal(psVar4);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"in_double",(allocator<char> *)local_88);
  uVar6 = dynamicgraph::Entity::getSignal(psVar4);
  plVar7 = (long *)__dynamic_cast(uVar6,&dynamicgraph::SignalBase<int>::typeinfo,
                                  &dynamicgraph::Signal<double,int>::typeinfo,0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"out_vector",(allocator<char> *)local_88);
  uVar6 = dynamicgraph::Entity::getSignal(psVar4);
  plVar8 = (long *)__dynamic_cast(uVar6,&dynamicgraph::SignalBase<int>::typeinfo,
                                  &dynamicgraph::Signal<Eigen::Matrix<double,-1,1,0,-1,1>,int>::
                                   typeinfo,0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"output2",(allocator<char> *)local_88);
  dynamicgraph::Tracer::addSignalToTrace((SignalBase *)psVar2,psVar5);
  std::__cxx11::string::~string((string *)local_c8);
  local_c8[0] = 0;
  local_c8[1] = 0x3ff80000;
  (**(code **)(*plVar7 + 0xc0))(plVar7,local_c8);
  psVar2[0x1c0] = (string)0x1;
  iVar1 = 0;
  while (local_c8[0] = iVar1, iVar1 < 1000) {
    (**(code **)(*(long *)psVar5 + 0x18))(psVar5,local_c8);
    (**(code **)(*plVar7 + 0xe0))(plVar7,local_c8);
    (**(code **)(*plVar7 + 0x18))(plVar7,local_c8);
    (**(code **)(*plVar8 + 0x98))(plVar8,local_c8);
    (**(code **)(*plVar8 + 0x18))(plVar8,local_c8);
    dynamicgraph::Tracer::recordTrigger((int *)psVar2,local_c8);
    iVar1 = local_c8[0] + 1;
  }
  psVar2[0x1c0] = (string)0x0;
  dynamicgraph::Tracer::clearSignalToTrace();
  (**(code **)(*(long *)psVar2 + 0x48))(psVar2);
  dynamicgraph::Tracer::record();
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_tracer) {
  using dynamicgraph::Vector;

  // Creates a tracer.
  dynamicgraph::Tracer &atracer = *dynamic_cast<dynamicgraph::Tracer *>(
      dynamicgraph::FactoryStorage::getInstance()->newEntity("Tracer",
                                                             "my-tracer"));

  dynamicgraph::Entity &entity =
      *dynamicgraph::FactoryStorage::getInstance()->newEntity("MyEntity",
                                                              "my-entity");

  std::string rootdir("/tmp");
  std::string basename("my-tracer");
  std::string suffix(".dat");

  /// Test openfiles
  atracer.openFiles(rootdir, basename, suffix);

  /// Add trace by name
  atracer.addSignalToTraceByName("my-entity.out_double", "output");
  /// Add trace by name
  atracer.addSignalToTraceByName("my-entity.out_vector", "output-vector");

  dynamicgraph::SignalBase<int> &aSignal = entity.getSignal("out2double");

  dynamicgraph::Signal<double, int> &aSignalInt =
      *(dynamic_cast<dynamicgraph::Signal<double, int> *>(
          &entity.getSignal("in_double")));

  dynamicgraph::Signal<Vector, int> &aSignalVector =
      *(dynamic_cast<dynamicgraph::Signal<Vector, int> *>(
          &entity.getSignal("out_vector")));

  /// Add trace by signal object
  atracer.addSignalToTrace(aSignal, "output2");

  aSignalInt.setConstant(1.5);

  atracer.start();

  for (int i = 0; i < 1000; i++) {
    aSignal.setTime(i);
    aSignalInt.access(i);
    aSignalInt.setTime(i);
    aSignalVector.recompute(i);
    aSignalVector.setTime(i);
    atracer.recordTrigger(i, i);
  }

  atracer.stop();
  atracer.clearSignalToTrace();
  atracer.closeFiles();

  atracer.record();
}